

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary.cc
# Opt level: O0

void LabelDict::free_label_features(label_feature_map *lfm)

{
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  v_hashmap<unsigned_long,_features> *in_RDI;
  features *res;
  void *label_iter;
  
  for (this = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)v_hashmap<unsigned_long,_features>::iterator(in_RDI);
      this != (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x0;
      this = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)v_hashmap<unsigned_long,_features>::iterator_next(in_RDI,this)) {
    v_hashmap<unsigned_long,_features>::iterator_get_value(in_RDI,this);
    v_array<float>::delete_v((v_array<float> *)this);
    v_array<unsigned_long>::delete_v((v_array<unsigned_long> *)this);
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::delete_v(this);
  }
  v_hashmap<unsigned_long,_features>::clear((v_hashmap<unsigned_long,_features> *)0x0);
  v_hashmap<unsigned_long,_features>::delete_v((v_hashmap<unsigned_long,_features> *)0x3a0970);
  return;
}

Assistant:

void free_label_features(label_feature_map& lfm)
{
  void* label_iter = lfm.iterator();
  while (label_iter != nullptr)
  {
    features* res = lfm.iterator_get_value(label_iter);
    res->values.delete_v();
    res->indicies.delete_v();
    res->space_names.delete_v();

    label_iter = lfm.iterator_next(label_iter);
  }
  lfm.clear();
  lfm.delete_v();
}